

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testchar.c
# Opt level: O0

int testDocumentRangeByte1
              (xmlParserCtxtPtr ctxt,char *document,int len,char *data,int forbid1,int forbid2)

{
  long lVar1;
  xmlDocPtr res;
  int i;
  int forbid2_local;
  int forbid1_local;
  char *data_local;
  int len_local;
  char *document_local;
  xmlParserCtxtPtr ctxt_local;
  
  res._4_4_ = 0;
  do {
    if (0xff < (int)res._4_4_) {
      return 0;
    }
    lastError = 0;
    xmlCtxtReset(ctxt);
    *data = (char)res._4_4_;
    lVar1 = xmlReadMemory(document,len,"test",0,0);
    if ((res._4_4_ == forbid1) || (res._4_4_ == forbid2)) {
      if ((lastError == 0) || (lVar1 != 0)) {
        fprintf(_stderr,"Failed to detect invalid char for Byte 0x%02X: %c\n",(ulong)res._4_4_,
                (ulong)res._4_4_);
        return 1;
      }
    }
    else if ((res._4_4_ == 0x3c) || (res._4_4_ == 0x26)) {
      if ((lastError == 0) || (lVar1 != 0)) {
        fprintf(_stderr,"Failed to detect illegal char %c for Byte 0x%02X\n",(ulong)res._4_4_,
                (ulong)res._4_4_);
        return 1;
      }
    }
    else if (((((int)res._4_4_ < 0x20) || (0x7f < (int)res._4_4_)) && (res._4_4_ != 9)) &&
            ((res._4_4_ != 10 && (res._4_4_ != 0xd)))) {
      if ((lastError != 9) && (lVar1 != 0)) {
        fprintf(_stderr,"Failed to detect invalid char for Byte 0x%02X\n",(ulong)res._4_4_);
        return 1;
      }
    }
    else if (lVar1 == 0) {
      fprintf(_stderr,"Failed to parse valid char for Byte 0x%02X : %c\n",(ulong)res._4_4_,
              (ulong)res._4_4_);
      return 1;
    }
    if (lVar1 != 0) {
      xmlFreeDoc(lVar1);
    }
    res._4_4_ = res._4_4_ + 1;
  } while( true );
}

Assistant:

static int testDocumentRangeByte1(xmlParserCtxtPtr ctxt, char *document,
                  int len,  char *data, int forbid1, int forbid2) {
    int i;
    xmlDocPtr res;

    for (i = 0;i <= 0xFF;i++) {
	lastError = 0;
	xmlCtxtReset(ctxt);

        data[0] = (char) i;

	res = xmlReadMemory(document, len, "test", NULL, 0);

	if ((i == forbid1) || (i == forbid2)) {
	    if ((lastError == 0) || (res != NULL)) {
	        fprintf(stderr,
		    "Failed to detect invalid char for Byte 0x%02X: %c\n",
		        i, i);
		return(1);
	    }
	}

	else if ((i == '<') || (i == '&')) {
	    if ((lastError == 0) || (res != NULL)) {
	        fprintf(stderr,
		    "Failed to detect illegal char %c for Byte 0x%02X\n", i, i);
		return(1);
	    }
	}
	else if (((i < 0x20) || (i >= 0x80)) &&
	    (i != 0x9) && (i != 0xA) && (i != 0xD)) {
	    if ((lastError != XML_ERR_INVALID_CHAR) && (res != NULL)) {
	        fprintf(stderr,
		    "Failed to detect invalid char for Byte 0x%02X\n", i);
		return(1);
	    }
	}
	else if (res == NULL) {
	    fprintf(stderr,
		"Failed to parse valid char for Byte 0x%02X : %c\n", i, i);
		return(1);
	}
	if (res != NULL)
	    xmlFreeDoc(res);
    }
    return(0);
}